

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_gsketch.c
# Opt level: O0

void base_update_impl(dds_gsketch *gsketch,double value,long count)

{
  store_type sVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  dds_bucket_id_mapping *bid_mapping;
  dds_bucket_id_mapping *pdVar5;
  double dVar6;
  int local_38;
  int num_buckets;
  int num_nbuckets;
  int num_pbuckets;
  int bid;
  double absvalue;
  long count_local;
  double value_local;
  dds_gsketch *gsketch_local;
  
  dVar6 = ABS(value);
  _Var2 = dds_sketch_is_addressable(&gsketch->super,dVar6);
  if (_Var2) {
    if (gsketch->min_addressable_absvalue <= dVar6) {
      iVar3 = dds_get_bucket_id(gsketch->id_map,dVar6);
      if (count < 1) {
        if (count < 0) {
          if (value <= 0.0) {
            dds_store_remove(gsketch->nestore,iVar3,count);
          }
          else {
            dds_store_remove(gsketch->postore,iVar3,count);
          }
        }
      }
      else if (value <= 0.0) {
        dds_store_insert(gsketch->nestore,iVar3,count);
      }
      else {
        dds_store_insert(gsketch->postore,iVar3,count);
      }
    }
    else if (count < 1) {
      if ((count < 0) && (-1 < gsketch->zero_bucket + count)) {
        gsketch->zero_bucket = count + gsketch->zero_bucket;
      }
    }
    else {
      gsketch->zero_bucket = count + gsketch->zero_bucket;
    }
  }
  iVar3 = get_num_pvalue_buckets(gsketch);
  iVar4 = get_num_nvalue_buckets(gsketch);
  local_38 = iVar3 + iVar4;
  if (gsketch->max_sketch_size < local_38) {
    sVar1 = gsketch->store_type;
    if (sVar1 == COLLAPSINGHIGH_MAPSTORE) {
      if (iVar4 < gsketch->max_sketch_size) {
        dds_mapstore_resize((dds_mapstore *)gsketch->postore,gsketch->max_sketch_size - iVar4);
      }
      else {
        iVar3 = dds_mapstore_resize((dds_mapstore *)gsketch->postore,1);
        dds_mapstore_resize((dds_mapstore *)gsketch->nestore,gsketch->max_sketch_size - iVar3);
      }
    }
    else if (sVar1 == COLLAPSINGLOW_MAPSTORE) {
      if (iVar3 < gsketch->max_sketch_size) {
        dds_mapstore_resize((dds_mapstore *)gsketch->nestore,gsketch->max_sketch_size - iVar3);
      }
      else {
        iVar3 = dds_mapstore_resize((dds_mapstore *)gsketch->nestore,1);
        dds_mapstore_resize((dds_mapstore *)gsketch->postore,gsketch->max_sketch_size - iVar3);
      }
    }
    else if (sVar1 == COLLAPSINGALL_MAPSTORE) {
      while (gsketch->max_sketch_size < local_38) {
        local_38 = 0;
        iVar3 = dds_store_get_num_buckets(gsketch->nestore);
        if (0 < iVar3) {
          dds_mapstore_collapse((dds_mapstore *)gsketch->nestore);
          local_38 = dds_store_get_num_buckets(gsketch->nestore);
        }
        iVar3 = dds_store_get_num_buckets(gsketch->postore);
        if (0 < iVar3) {
          dds_mapstore_collapse((dds_mapstore *)gsketch->postore);
          iVar3 = dds_store_get_num_buckets(gsketch->postore);
          local_38 = iVar3 + local_38;
        }
        bid_mapping = dds_sketch_get_id_mapping(&gsketch->super);
        pdVar5 = dds_sketch_get_id_mapping(&gsketch->super);
        dVar6 = pow(pdVar5->gamma_value,2.0);
        dds_bucket_id_mapping_update(bid_mapping,dVar6);
      }
    }
  }
  return;
}

Assistant:

static void base_update_impl(struct dds_gsketch *gsketch, double value, long count){
    double absvalue = fabs(value);
    if (dds_sketch_is_addressable(gsketch, absvalue)) {
        if (absvalue < gsketch->min_addressable_absvalue) {
            if (count > 0) {
                gsketch->zero_bucket += count;
            } else if (count < 0 && (gsketch->zero_bucket + count) >= 0) {
                gsketch->zero_bucket += count;
            }
        } else {
            int bid = dds_get_bucket_id(gsketch->id_map, absvalue);
            if (count > 0) {
                if (value > 0) {
                    dds_store_insert(gsketch->postore, bid, count);
                } else {
                    dds_store_insert(gsketch->nestore, bid, count);
                }
            } else if (count < 0) {
                if (value > 0) {
                    dds_store_remove(gsketch->postore, bid, count);
                } else {
                    dds_store_remove(gsketch->nestore, bid, count);
                }
            }
        }
    }
    int num_pbuckets = get_num_pvalue_buckets(gsketch);
    int num_nbuckets = get_num_nvalue_buckets(gsketch);
    int num_buckets = num_pbuckets + num_nbuckets;
    if (num_buckets > gsketch->max_sketch_size) {
        switch(gsketch->store_type) {
            case COLLAPSINGHIGH_MAPSTORE:
                if (num_nbuckets < gsketch->max_sketch_size) {
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, gsketch->max_sketch_size - num_nbuckets);
                } else {
                    num_pbuckets = dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, 1);
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, gsketch->max_sketch_size - num_pbuckets);
                }
                break;
            case COLLAPSINGLOW_MAPSTORE:
                if (num_pbuckets < gsketch->max_sketch_size) {
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, gsketch->max_sketch_size - num_pbuckets);
                } else {
                    num_nbuckets = dds_mapstore_resize((struct dds_mapstore*)gsketch->nestore, 1);
                    dds_mapstore_resize((struct dds_mapstore*)gsketch->postore, gsketch->max_sketch_size - num_nbuckets);
                }
                break;
            case COLLAPSINGALL_MAPSTORE:
                while (num_buckets > gsketch->max_sketch_size) { // we reached the max number of buckets
                    num_buckets = 0;
                    if (dds_store_get_num_buckets(gsketch->nestore) > 0) {
                        dds_mapstore_collapse((struct dds_mapstore *) gsketch->nestore);
                        num_buckets += dds_store_get_num_buckets(gsketch->nestore);
                    }
                    if (dds_store_get_num_buckets(gsketch->postore) > 0) {
                        dds_mapstore_collapse((struct dds_mapstore *) gsketch->postore);
                        num_buckets += dds_store_get_num_buckets(gsketch->postore);
                    }
                    dds_bucket_id_mapping_update(dds_sketch_get_id_mapping((struct dds_sketch*)gsketch), pow(dds_sketch_get_id_mapping((struct dds_sketch*)gsketch)->gamma_value,2.0));
                }
                break;
            default:
                return;
        }
    }
}